

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

void sv_send_cb(uv_udp_send_t *req,int status)

{
  uv_udp_t *puVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == (uv_udp_send_t *)0x0) {
    pcVar3 = "!=";
    eval_a = 0;
    pcVar4 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar5 = 0x69;
  }
  else {
    eval_a = (int64_t)status;
    if (eval_a == 0) {
      puVar1 = req->handle;
      if (puVar1 == &client || puVar1 == &server) {
        uv_close(puVar1,close_cb);
        free(req);
        sv_send_cb_called = sv_send_cb_called + 1;
        return;
      }
      pcVar3 = "!=";
      pcVar2 = "(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client";
      uVar5 = 0x6b;
      eval_a = 0;
    }
    else {
      pcVar3 = "==";
      pcVar2 = "status";
      uVar5 = 0x6a;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar4 = "0";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,0);
  abort();
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);

  uv_close((uv_handle_t*) req->handle, close_cb);
  free(req);

  sv_send_cb_called++;
}